

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteBuiltinTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# ======================================",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Built-in targets\n\n",0x14);
  WriteTargetAll(this,os);
  WriteTargetRebuildManifest(this,os);
  WriteTargetClean(this,os);
  WriteTargetHelp(this,os);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuiltinTargets(std::ostream& os)
{
  // Write headers.
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Built-in targets\n\n";

  this->WriteTargetAll(os);
  this->WriteTargetRebuildManifest(os);
  this->WriteTargetClean(os);
  this->WriteTargetHelp(os);
}